

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O0

FT_Error af_loader_reset(AF_Loader loader,AF_Module module,FT_Face face)

{
  FT_Error local_24;
  FT_Error error;
  FT_Face face_local;
  AF_Module module_local;
  AF_Loader loader_local;
  
  local_24 = 0;
  loader->face = face;
  loader->globals = (AF_FaceGlobals)(face->autohint).data;
  if ((loader->globals == (AF_FaceGlobals)0x0) &&
     (local_24 = af_face_globals_new(face,&loader->globals,module), local_24 == 0)) {
    (face->autohint).data = loader->globals;
    (face->autohint).finalizer = af_face_globals_free;
  }
  return local_24;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_loader_reset( AF_Loader  loader,
                   AF_Module  module,
                   FT_Face    face )
  {
    FT_Error  error = FT_Err_Ok;


    loader->face    = face;
    loader->globals = (AF_FaceGlobals)face->autohint.data;

    if ( !loader->globals )
    {
      error = af_face_globals_new( face, &loader->globals, module );
      if ( !error )
      {
        face->autohint.data =
          (FT_Pointer)loader->globals;
        face->autohint.finalizer =
          (FT_Generic_Finalizer)af_face_globals_free;
      }
    }

    return error;
  }